

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xc_kernel.cxx
# Opt level: O1

ostream * ExchCXX::operator<<(ostream *out,Kernel kern)

{
  pointer pcVar1;
  mapped_type *pmVar2;
  Kernel local_3c;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  local_3c = kern;
  pmVar2 = std::
           map<ExchCXX::Kernel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ExchCXX::Kernel>,_std::allocator<std::pair<const_ExchCXX::Kernel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at((map<ExchCXX::Kernel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ExchCXX::Kernel>,_std::allocator<std::pair<const_ExchCXX::Kernel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(kernel_map_abi_cxx11_ + 0x30),&local_3c);
  pcVar1 = (pmVar2->_M_dataplus)._M_p;
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + pmVar2->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(out,(char *)local_38,local_30);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return out;
}

Assistant:

std::ostream& operator<<( std::ostream& out, Kernel kern ) {
  out << kernel_map.key(kern);
  return out;
}